

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchclient.hpp
# Opt level: O0

BatchResponse * __thiscall
jsonrpccxx::BatchClient::BatchCall
          (BatchResponse *__return_storage_ptr__,BatchClient *this,BatchRequest *request)

{
  IClientConnector *pIVar1;
  bool bVar2;
  json *this_00;
  JsonRpcException *this_01;
  parse_error *e;
  string local_c0;
  function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  local_a0;
  string_t local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  json response;
  BatchRequest *request_local;
  BatchClient *this_local;
  
  pIVar1 = (this->super_JsonRpcClient).connector;
  response.m_value = (json_value)request;
  this_00 = BatchRequest::Build_abi_cxx11_(request);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::dump(&local_70,this_00,-1,' ',false,strict);
  (*pIVar1->_vptr_IClientConnector[2])(&local_50,pIVar1,&local_70);
  std::
  function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::function(&local_a0,(nullptr_t)0x0);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<std::__cxx11::string>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)local_30,&local_50,&local_a0,true,false);
  std::
  function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::~function(&local_a0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  bVar2 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::is_array((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_30);
  if (!bVar2) {
    e._6_1_ = 1;
    this_01 = (JsonRpcException *)__cxa_allocate_exception(0x60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"invalid JSON response from server: expected array",
               (allocator<char> *)((long)&e + 7));
    JsonRpcException::JsonRpcException(this_01,-0x7fbc,&local_c0);
    e._6_1_ = 0;
    __cxa_throw(this_01,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
  }
  BatchResponse::BatchResponse(__return_storage_ptr__,(json *)local_30);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_30);
  return __return_storage_ptr__;
}

Assistant:

BatchResponse BatchCall(const BatchRequest &request) {
      try {
        json response = json::parse(connector.Send(request.Build().dump()));
        if (!response.is_array()) {
          throw JsonRpcException(parse_error, std::string("invalid JSON response from server: expected array"));
        }
        return BatchResponse(std::move(response));
      } catch (json::parse_error &e) {
        throw JsonRpcException(parse_error, std::string("invalid JSON response from server: ") + e.what());
      }
    }